

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O2

size_t ht_registry_push_registry_klasses_to_listener
                 (HT_TimelineListenerCallback callback,void *listener,HT_Boolean serialize)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  HT_EventIdProvider *pHVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  size_t local_10c0;
  HT_EventKlassInfoEvent event;
  HT_Event local_1078;
  undefined4 local_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined1 local_1040;
  HT_Byte data [4096];
  
  ht_mutex_lock(event_klass_registry_register_mutex);
  sVar9 = 0;
  sVar8 = 0;
  for (uVar7 = 0; uVar7 < event_klass_register.size; uVar7 = uVar7 + 1) {
    plVar2 = (long *)event_klass_register.data[uVar7];
    event.base.klass = ht_HT_EventKlassInfoEvent_get_event_klass_instance();
    pHVar5 = ht_event_id_provider_get_default();
    event.base.id = ht_event_id_provider_next(pHVar5);
    event.base.timestamp = ht_monotonic_clock_get_timestamp();
    event.event_klass_name = *(char **)*plVar2;
    event.info_klass_id = *(HT_EventKlassId *)(plVar2 + 3);
    event.field_count = *(uint8_t *)((undefined8 *)*plVar2 + 1);
    sVar6 = ht_HT_EventKlassInfoEvent_get_size(&event.base);
    if (0x1000 - sVar9 < sVar6) {
      (*callback)(data,sVar9,serialize,listener);
      local_10c0 = sVar9;
      sVar9 = 0;
    }
    else {
      local_10c0 = 0;
    }
    sVar6 = ht_event_utils_serialize_event_to_buffer(&event.base,data + sVar9,serialize);
    sVar9 = sVar6 + sVar9;
    lVar10 = 0x28;
    for (uVar11 = 0; uVar11 < *(ulong *)(*plVar2 + 8); uVar11 = uVar11 + 1) {
      local_1078.klass = ht_HT_EventKlassFieldInfoEvent_get_event_klass_instance();
      lVar3 = *(long *)(*plVar2 + 0x20);
      pHVar5 = ht_event_id_provider_get_default();
      local_1078.id = ht_event_id_provider_next(pHVar5);
      local_1078.timestamp = ht_monotonic_clock_get_timestamp();
      iVar4 = *(int *)(lVar3 + lVar10);
      if ((iVar4 == 3) && (*(int *)(lVar3 + -8 + lVar10) == 0)) {
        iVar4 = 99;
      }
      local_1040 = (undefined1)iVar4;
      local_1060 = (undefined4)plVar2[3];
      puVar1 = (undefined8 *)(lVar3 + -0x28 + lVar10);
      local_1058 = *puVar1;
      uStack_1050 = puVar1[1];
      local_1048 = *(undefined8 *)(lVar3 + -0x18 + lVar10);
      sVar6 = ht_HT_EventKlassFieldInfoEvent_get_size(&local_1078);
      if (0x1000 - sVar9 < sVar6) {
        (*callback)(data,sVar9,serialize,listener);
        local_10c0 = local_10c0 + sVar9;
        sVar9 = 0;
      }
      sVar6 = ht_event_utils_serialize_event_to_buffer(&local_1078,data + sVar9,serialize);
      sVar9 = sVar9 + sVar6;
      lVar10 = lVar10 + 0x30;
    }
    sVar8 = sVar8 + local_10c0;
  }
  ht_mutex_unlock(event_klass_registry_register_mutex);
  if (sVar9 != 0) {
    (*callback)(data,sVar9,serialize,listener);
    sVar8 = sVar8 + sVar9;
  }
  return sVar8;
}

Assistant:

size_t
ht_registry_push_registry_klasses_to_listener(HT_TimelineListenerCallback callback, void* listener, HT_Boolean serialize)
{
    size_t i;
    size_t total_size = 0;

    HT_Byte data[REGISTRY_LISETNER_BUFF_SIZE];
    size_t data_pos = 0;

    ht_mutex_lock(event_klass_registry_register_mutex);

    for (i = 0; i < event_klass_register.size; i++)
    {
        total_size += _ht_registry_push_class_to_listener((HT_EventKlass*)event_klass_register.data[i], data, &data_pos, callback, listener, serialize);
    }

    ht_mutex_unlock(event_klass_registry_register_mutex);

    if (data_pos > 0)
    {
        callback(data, data_pos, serialize, listener);
        total_size += data_pos;
    }

    return total_size;
}